

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vgm_Emu.cpp
# Opt level: O1

blargg_err_t __thiscall Vgm_Emu::load_mem_(Vgm_Emu *this,byte_ *new_data,long new_size)

{
  blip_resampled_time_t bVar1;
  char *pcVar2;
  blargg_err_t pcVar3;
  char **ppcVar4;
  ulong rate;
  
  if (new_size < 0x41) {
    pcVar2 = "Wrong file type for this emulator";
  }
  else {
    if (*(int *)new_data == 0x206d6756) {
      pcVar2 = (char *)0x0;
    }
    else {
      pcVar2 = "Wrong file type for this emulator";
    }
    if (pcVar2 == (char *)0x0) {
      rate = 0x369e99;
      if (*(uint *)(new_data + 0xc) != 0) {
        rate = (ulong)*(uint *)(new_data + 0xc);
      }
      this->psg_rate = rate;
      (this->super_Vgm_Emu_Impl).blip_buf.clock_rate_ = rate;
      bVar1 = Blip_Buffer::clock_rate_factor(&(this->super_Vgm_Emu_Impl).blip_buf,rate);
      (this->super_Vgm_Emu_Impl).blip_buf.factor_ = bVar1;
      (this->super_Vgm_Emu_Impl).data = new_data;
      (this->super_Vgm_Emu_Impl).data_end = new_data + new_size;
      (this->super_Vgm_Emu_Impl).loop_begin = new_data + new_size;
      if (*(uint *)(new_data + 0x1c) != 0) {
        (this->super_Vgm_Emu_Impl).loop_begin = new_data + (ulong)*(uint *)(new_data + 0x1c) + 0x1c;
      }
      (this->super_Vgm_Emu_Impl).super_Classic_Emu.super_Music_Emu.voice_count_ = 4;
      pcVar2 = setup_fm(this);
      if (pcVar2 == (blargg_err_t)0x0) {
        ppcVar4 = load_mem_::psg_names;
        if (this->uses_fm != false) {
          ppcVar4 = load_mem_::fm_names;
        }
        (this->super_Vgm_Emu_Impl).super_Classic_Emu.super_Music_Emu.voice_names_ = ppcVar4;
        pcVar3 = Classic_Emu::setup_buffer((Classic_Emu *)this,this->psg_rate);
        return pcVar3;
      }
    }
  }
  return pcVar2;
}

Assistant:

blargg_err_t Vgm_Emu::load_mem_( byte const* new_data, long new_size )
{
	assert( offsetof (header_t,unused2 [8]) == header_size );
	
	if ( new_size <= header_size )
		return gme_wrong_file_type;
	
	header_t const& h = *(header_t const*) new_data;
	
	RETURN_ERR( check_vgm_header( h ) );
	
	check( get_le32( h.version ) <= 0x150 );
	
	// psg rate
	psg_rate = get_le32( h.psg_rate );
	if ( !psg_rate )
		psg_rate = 3579545;
	blip_buf.clock_rate( psg_rate );
	
	data     = new_data;
	data_end = new_data + new_size;
	
	// get loop
	loop_begin = data_end;
	if ( get_le32( h.loop_offset ) )
		loop_begin = &data [get_le32( h.loop_offset ) + offsetof (header_t,loop_offset)];
	
	set_voice_count( psg.osc_count );
	
	RETURN_ERR( setup_fm() );
	
	static const char* const fm_names [] = {
		"FM 1", "FM 2", "FM 3", "FM 4", "FM 5", "FM 6", "PCM", "PSG"
	};
	static const char* const psg_names [] = { "Square 1", "Square 2", "Square 3", "Noise" };
	set_voice_names( uses_fm ? fm_names : psg_names );
	
	// do after FM in case output buffer is changed
	return Classic_Emu::setup_buffer( psg_rate );
}